

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

Snapshot * __thiscall
cmState::CreateFunctionCallSnapshot
          (Snapshot *__return_storage_ptr__,cmState *this,Snapshot originSnapshot,
          string *entryPointCommand,long entryPointLine,string *fileName)

{
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer pcVar1;
  cmLinkedTree<cmDefinitions> *pcVar2;
  PositionType PVar3;
  PositionType PVar4;
  iterator it;
  cmState *pcVar5;
  ReferenceType __src;
  PointerType pSVar6;
  PointerType pBVar7;
  PointerType pSVar8;
  iterator iVar9;
  iterator iVar10;
  iterator local_170;
  Snapshot *local_160;
  long local_158;
  string *local_150;
  string *local_148;
  cmState *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [168];
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  long local_50;
  size_type sStack_48;
  size_type local_40;
  size_type sStack_38;
  
  it = originSnapshot.Position;
  local_160 = __return_storage_ptr__;
  local_158 = entryPointLine;
  local_150 = entryPointCommand;
  local_148 = fileName;
  local_140 = this;
  __src = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator*(&originSnapshot.Position);
  memcpy((SnapshotDataType *)local_118,__src,0xa8);
  pcVar1 = (__src->EntryPointCommand)._M_dataplus._M_p;
  local_70._M_p = (pointer)&local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (__src->EntryPointCommand)._M_string_length);
  local_50 = __src->EntryPointLine;
  sStack_48 = __src->IncludeDirectoryPosition;
  local_40 = __src->CompileDefinitionsPosition;
  sStack_38 = __src->CompileOptionsPosition;
  local_170 = cmLinkedTree<cmState::SnapshotDataType>::Push
                        (&this->SnapshotData,it,(SnapshotDataType *)local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
  }
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_170);
  (pSVar6->ScopeParent).Tree = originSnapshot.Position.Tree;
  (pSVar6->ScopeParent).Position = originSnapshot.Position.Position;
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_170);
  pSVar6->EntryPointLine = local_158;
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_170);
  std::__cxx11::string::_M_assign((string *)&pSVar6->EntryPointCommand);
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_170);
  pSVar6->SnapshotType = FunctionCallType;
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_170);
  pcVar5 = local_140;
  pSVar6->Keep = false;
  this_00 = &local_140->ExecutionListFiles;
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  iVar9 = pSVar6->ExecutionListFile;
  pcVar1 = (local_148->_M_dataplus)._M_p;
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,pcVar1,pcVar1 + local_148->_M_string_length);
  iVar9 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Push(this_00,iVar9,&local_138);
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_170);
  pSVar6->ExecutionListFile = iVar9;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_170);
  pBVar7 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar6->BuildSystemDirectory);
  (pBVar7->DirectoryEnd).Tree = local_170.Tree;
  (pBVar7->DirectoryEnd).Position = local_170.Position;
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  pSVar8 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_170);
  PVar4 = (pSVar6->Policies).Position;
  (pSVar8->PolicyScope).Tree = (pSVar6->Policies).Tree;
  (pSVar8->PolicyScope).Position = PVar4;
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  pcVar2 = (pSVar6->Vars).Tree;
  if ((pcVar2 != (cmLinkedTree<cmDefinitions> *)0x0) &&
     ((pSVar6->Vars).Position <=
      (ulong)(((long)(pcVar2->Data).
                     super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pcVar2->Data).
                     super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7))) {
    pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position)
    ;
    pcVar2 = (pSVar6->Vars).Tree;
    PVar3 = (pSVar6->Vars).Position;
    iVar10 = pSVar6->Vars;
    pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_170);
    (pSVar6->Parent).Tree = pcVar2;
    (pSVar6->Parent).Position = PVar3;
    iVar10 = cmLinkedTree<cmDefinitions>::Push(&pcVar5->VarTree,iVar10);
    pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_170);
    pSVar6->Vars = iVar10;
    local_160->State = pcVar5;
    (local_160->Position).Tree = local_170.Tree;
    (local_160->Position).Position = local_170.Position;
    return local_160;
  }
  __assert_fail("originSnapshot.Position->Vars.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                ,0x388,
                "cmState::Snapshot cmState::CreateFunctionCallSnapshot(cmState::Snapshot, const std::string &, long, const std::string &)"
               );
}

Assistant:

cmState::Snapshot
cmState::CreateFunctionCallSnapshot(cmState::Snapshot originSnapshot,
                                    std::string const& entryPointCommand,
                                    long entryPointLine,
                                    std::string const& fileName)
{
  PositionType pos = this->SnapshotData.Push(originSnapshot.Position,
                                             *originSnapshot.Position);
  pos->ScopeParent = originSnapshot.Position;
  pos->EntryPointLine = entryPointLine;
  pos->EntryPointCommand = entryPointCommand;
  pos->SnapshotType = FunctionCallType;
  pos->Keep = false;
  pos->ExecutionListFile = this->ExecutionListFiles.Push(
        originSnapshot.Position->ExecutionListFile, fileName);
  pos->BuildSystemDirectory->DirectoryEnd = pos;
  pos->PolicyScope = originSnapshot.Position->Policies;
  assert(originSnapshot.Position->Vars.IsValid());
  cmLinkedTree<cmDefinitions>::iterator origin =
      originSnapshot.Position->Vars;
  pos->Parent = origin;
  pos->Vars = this->VarTree.Push(origin);
  return cmState::Snapshot(this, pos);
}